

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

int __thiscall QSocks5SocketEngine::option(QSocks5SocketEngine *this,SocketOption option)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = -1;
  if ((*(long **)(*(long *)(this + 8) + 0xf8) != (long *)0x0) &&
     (plVar1 = (long *)**(long **)(*(long *)(this + 8) + 0xf8), plVar1 != (long *)0x0)) {
    if (option == KeepAliveOption) {
      lVar3 = *plVar1;
      uVar4 = 1;
    }
    else {
      if (option != LowDelayOption) goto LAB_00221d5d;
      lVar3 = *plVar1;
      uVar4 = 0;
    }
    (**(code **)(lVar3 + 0x128))(&QStack_38,plVar1,uVar4);
    iVar2 = QVariant::toInt((bool *)&QStack_38);
    QVariant::~QVariant(&QStack_38);
  }
LAB_00221d5d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QSocks5SocketEngine::option(SocketOption option) const
{
    Q_D(const QSocks5SocketEngine);
    if (d->data && d->data->controlSocket) {
        // convert the enum and call the real socket
        if (option == QAbstractSocketEngine::LowDelayOption)
            return d->data->controlSocket->socketOption(QAbstractSocket::LowDelayOption).toInt();
        if (option == QAbstractSocketEngine::KeepAliveOption)
            return d->data->controlSocket->socketOption(QAbstractSocket::KeepAliveOption).toInt();
    }
    return -1;
}